

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partmap.hh
# Opt level: O2

vector<TrackedContext,_std::allocator<TrackedContext>_> * __thiscall
partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>::split
          (partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_> *this,
          Address *pnt)

{
  iterator iVar1;
  long lVar2;
  mapped_type *this_00;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *__x;
  
  iVar1 = std::
          _Rb_tree<Address,_std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>,_std::_Select1st<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
          ::upper_bound((_Rb_tree<Address,_std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>,_std::_Select1st<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
                         *)this,pnt);
  if (iVar1._M_node == (this->database)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    this_00 = std::
              map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
              ::operator[](&this->database,pnt);
    __x = &this->defaultvalue;
  }
  else {
    lVar2 = std::_Rb_tree_decrement(iVar1._M_node);
    if ((*(AddrSpace **)(lVar2 + 0x20) == pnt->base) && (*(uintb *)(lVar2 + 0x28) == pnt->offset)) {
      return (vector<TrackedContext,_std::allocator<TrackedContext>_> *)(lVar2 + 0x30);
    }
    this_00 = std::
              map<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>_>_>
              ::operator[](&this->database,pnt);
    __x = (vector<TrackedContext,_std::allocator<TrackedContext>_> *)(lVar2 + 0x30);
  }
  std::vector<TrackedContext,_std::allocator<TrackedContext>_>::operator=(this_00,__x);
  return this_00;
}

Assistant:

_valuetype &partmap<_linetype,_valuetype>::
  split(const _linetype &pnt)

  {
    iterator iter;
    
    iter = database.upper_bound(pnt);
    if (iter != database.begin()) {
      --iter;
      if ((*iter).first == pnt)	// point matches exactly
	return (*iter).second;	// Return old ref
      _valuetype &newref( database[pnt] ); // Create new ref at point
      newref = (*iter).second;	// Copy of original partition value
      return newref;
    }
    _valuetype &newref( database[pnt] ); // Create new ref at point
    newref = defaultvalue;	// Copy of defaultvalue
    return newref;
  }